

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O2

string * __thiscall
license::FullLicenseInfo::printForSign_abi_cxx11_
          (string *__return_storage_ptr__,FullLicenseInfo *this)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  ostringstream oss;
  string local_1f0;
  string *local_1d0;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  trim_copy(&local_1c8,&this->m_project);
  toupper_copy(&local_1f0,&local_1c8);
  local_1d0 = __return_storage_ptr__;
  std::operator<<((ostream *)local_1a8,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c8);
  for (p_Var4 = (this->m_limits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_limits)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var4 + 1),"sig");
    if (bVar2) {
      trim_copy(&local_1f0,(string *)(p_Var4 + 1));
      poVar3 = std::operator<<((ostream *)local_1a8,(string *)&local_1f0);
      trim_copy(&local_1c8,(string *)(p_Var4 + 2));
      std::operator<<(poVar3,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
  }
  poVar3 = std::operator<<((ostream *)std::cout,"license to sign [");
  psVar1 = local_1d0;
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<(poVar3,(string *)&local_1f0);
  poVar3 = std::operator<<(poVar3,"]");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return psVar1;
}

Assistant:

string FullLicenseInfo::printForSign() const {
	ostringstream oss;
	oss << toupper_copy(trim_copy(m_project));
	for (auto &it : m_limits) {
		if (it.first != LICENSE_SIGNATURE) {
			oss << trim_copy(it.first) << trim_copy(it.second);
		}
	}

#ifndef NDEBUG
	cout << "license to sign [" << oss.str() << "]" << endl;
#endif
	return oss.str();
}